

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O0

void nn_sipc_init(nn_sipc *self,int src,nn_ep *ep,nn_fsm *owner)

{
  nn_streamhdr *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  nn_fsm_fn in_RDI;
  nn_fsm *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  nn_fsm_init(unaff_retaddr,in_RDI,(nn_fsm_fn)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
              (int)((ulong)in_RDX >> 0x20),in_RCX,
              (nn_fsm *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(undefined4 *)(in_RDI + 0x58) = 1;
  nn_streamhdr_init(in_RCX,in_stack_ffffffffffffffdc,(nn_fsm *)0x13eb81);
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined4 *)(in_RDI + 0x200) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x208) = 0;
  nn_pipebase_init((nn_pipebase *)in_RCX,
                   (nn_pipebase_vfptr *)
                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),(nn_ep *)0x13ebca);
  *(undefined4 *)(in_RDI + 0x2e8) = 0xffffffff;
  nn_msg_init((nn_msg *)in_RCX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(undefined4 *)(in_RDI + 0x358) = 0xffffffff;
  nn_msg_init((nn_msg *)in_RCX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  nn_fsm_event_init((nn_fsm_event *)0x13ec23);
  return;
}

Assistant:

void nn_sipc_init (struct nn_sipc *self, int src,
    struct nn_ep *ep, struct nn_fsm *owner)
{
    nn_fsm_init (&self->fsm, nn_sipc_handler, nn_sipc_shutdown,
        src, self, owner);
    self->state = NN_SIPC_STATE_IDLE;
    nn_streamhdr_init (&self->streamhdr, NN_SIPC_SRC_STREAMHDR, &self->fsm);
    self->usock = NULL;
    self->usock_owner.src = -1;
    self->usock_owner.fsm = NULL;
    nn_pipebase_init (&self->pipebase, &nn_sipc_pipebase_vfptr, ep);
    self->instate = -1;
    nn_msg_init (&self->inmsg, 0);
    self->outstate = -1;
    nn_msg_init (&self->outmsg, 0);
    nn_fsm_event_init (&self->done);
}